

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Projection::SetProjectionPrivate(Projection *this,uint8_t *data,uint64_t data_length)

{
  uint8_t *__dest;
  bool bVar1;
  
  if (data_length == 0 || data == (uint8_t *)0x0) {
    return false;
  }
  __dest = (uint8_t *)operator_new__(data_length,(nothrow_t *)&std::nothrow);
  bVar1 = __dest != (uint8_t *)0x0;
  if (bVar1) {
    if (this->private_data_ != (uint8_t *)0x0) {
      operator_delete__(this->private_data_);
    }
    this->private_data_ = __dest;
    this->private_data_length_ = data_length;
    memcpy(__dest,data,data_length);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Projection::SetProjectionPrivate(const uint8_t* data,
                                      uint64_t data_length) {
  if (data == NULL || data_length == 0) {
    return false;
  }

  if (data_length != static_cast<size_t>(data_length)) {
    return false;
  }

  uint8_t* new_private_data =
      new (std::nothrow) uint8_t[static_cast<size_t>(data_length)];
  if (new_private_data == NULL) {
    return false;
  }

  delete[] private_data_;
  private_data_ = new_private_data;
  private_data_length_ = data_length;
  memcpy(private_data_, data, static_cast<size_t>(data_length));

  return true;
}